

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scaling.c
# Opt level: O0

c_int unscale_data(OSQPWorkspace *work)

{
  long *in_RDI;
  
  mat_mult_scalar(*(csc **)(*in_RDI + 0x10),*(c_float *)(in_RDI[0x18] + 0x18));
  mat_premult_diag(*(csc **)(*in_RDI + 0x10),*(c_float **)(in_RDI[0x18] + 0x20));
  mat_postmult_diag(*(csc **)(*in_RDI + 0x10),*(c_float **)(in_RDI[0x18] + 0x20));
  vec_mult_scalar(*(c_float **)(*in_RDI + 0x20),*(c_float *)(in_RDI[0x18] + 0x18),*(c_int *)*in_RDI)
  ;
  vec_ew_prod(*(c_float **)(in_RDI[0x18] + 0x20),*(c_float **)(*in_RDI + 0x20),
              *(c_float **)(*in_RDI + 0x20),*(c_int *)*in_RDI);
  mat_premult_diag(*(csc **)(*in_RDI + 0x18),*(c_float **)(in_RDI[0x18] + 0x28));
  mat_postmult_diag(*(csc **)(*in_RDI + 0x18),*(c_float **)(in_RDI[0x18] + 0x20));
  vec_ew_prod(*(c_float **)(in_RDI[0x18] + 0x28),*(c_float **)(*in_RDI + 0x28),
              *(c_float **)(*in_RDI + 0x28),*(c_int *)(*in_RDI + 8));
  vec_ew_prod(*(c_float **)(in_RDI[0x18] + 0x28),*(c_float **)(*in_RDI + 0x30),
              *(c_float **)(*in_RDI + 0x30),*(c_int *)(*in_RDI + 8));
  return 0;
}

Assistant:

c_int unscale_data(OSQPWorkspace *work) {
  // Unscale cost
  mat_mult_scalar(work->data->P, work->scaling->cinv);
  mat_premult_diag(work->data->P, work->scaling->Dinv);
  mat_postmult_diag(work->data->P, work->scaling->Dinv);
  vec_mult_scalar(work->data->q, work->scaling->cinv, work->data->n);
  vec_ew_prod(work->scaling->Dinv, work->data->q, work->data->q, work->data->n);

  // Unscale constraints
  mat_premult_diag(work->data->A, work->scaling->Einv);
  mat_postmult_diag(work->data->A, work->scaling->Dinv);
  vec_ew_prod(work->scaling->Einv, work->data->l, work->data->l, work->data->m);
  vec_ew_prod(work->scaling->Einv, work->data->u, work->data->u, work->data->m);

  return 0;
}